

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb_idict_remove(stb_idict *a,stb_int32 k,stb_int32 *v)

{
  stb__stb_idict__hashpair *psVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar2 = stb_hashptr((void *)(ulong)(uint)k);
  if (k == 3) {
    if (a->has_del == '\0') {
      return 0;
    }
    if (v != (stb_int32 *)0x0) {
      *v = a->dv;
    }
    a->has_del = '\0';
  }
  else if (k == 1) {
    if (a->has_empty == '\0') {
      return 0;
    }
    if (v != (stb_int32 *)0x0) {
      *v = a->ev;
    }
    a->has_empty = '\0';
  }
  else {
    uVar5 = a->mask & uVar2;
    psVar1 = a->table;
    uVar4 = (ulong)uVar5;
    if (psVar1[uVar4].k == 1) {
      return 0;
    }
    if (psVar1[uVar4].k != k) {
      uVar4 = (ulong)uVar5;
      do {
        uVar4 = (ulong)((int)uVar4 + ((uVar2 >> 0x13) + (uVar2 >> 6) + uVar2 | 1) & a->mask);
        if (psVar1[uVar4].k == 1) {
          return 0;
        }
      } while (psVar1[uVar4].k != k);
    }
    psVar1[uVar4].k = 3;
    iVar3 = a->count + -1;
    a->count = iVar3;
    a->deleted = a->deleted + 1;
    if (v != (stb_int32 *)0x0) {
      *v = psVar1[uVar4].v;
      iVar3 = a->count;
    }
    if (a->shrink_threshhold <= iVar3) {
      if (a->delete_threshhold < a->deleted) {
        stb__stb_idict_rehash(a,a->limit);
        return 1;
      }
      return 1;
    }
    stb__stb_idict_rehash(a,a->limit >> 1);
  }
  return 1;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}